

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hpp
# Opt level: O3

void __thiscall
tf::Executor::_tear_down_async(Executor *this,Worker *worker,Node *node,Node **cache)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  atomic<unsigned_long> *paVar3;
  uint uVar4;
  Node *pNVar5;
  Semaphores *__ptr;
  undefined1 *__ptr_00;
  pointer pcVar6;
  int iVar7;
  
  pNVar5 = node->_parent;
  if (pNVar5 == (Node *)0x0) {
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->_topology_mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    psVar2 = &this->_num_topologies;
    *psVar2 = *psVar2 - 1;
    if (*psVar2 == 0) {
      std::condition_variable::notify_all();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
  }
  else {
    uVar4 = pNVar5->_nstate;
    LOCK();
    paVar3 = &pNVar5->_join_counter;
    (paVar3->super___atomic_base<unsigned_long>)._M_i =
         (paVar3->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if (((paVar3->super___atomic_base<unsigned_long>)._M_i == 0) && ((uVar4 & 0x20000000) != 0)) {
      if (*cache != (Node *)0x0) {
        _schedule(this,worker,*cache);
      }
      *cache = pNVar5;
    }
  }
  if ((node->_exception_ptr)._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  __ptr = (node->_semaphores)._M_t.
          super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>.
          _M_t.
          super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
          .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
  if (__ptr != (Semaphores *)0x0) {
    std::default_delete<tf::Node::Semaphores>::operator()
              ((default_delete<tf::Node::Semaphores> *)&node->_semaphores,__ptr);
  }
  (node->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                       *)&node->_handle);
  __ptr_00 = (undefined1 *)
             (node->_edges).super_SmallVectorImpl<tf::Node_*>.
             super_SmallVectorTemplateBase<tf::Node_*,_true>.
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  if ((U *)__ptr_00 !=
      &(node->_edges).super_SmallVectorImpl<tf::Node_*>.
       super_SmallVectorTemplateBase<tf::Node_*,_true>.
       super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
    free(__ptr_00);
  }
  pcVar6 = (node->_name)._M_dataplus._M_p;
  paVar1 = &(node->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar1) {
    operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(node,0xd8);
  return;
}

Assistant:

inline void Executor::_tear_down_async(Worker& worker, Node* node, Node*& cache) {
  
  // from executor
  if(auto parent = node->_parent; parent == nullptr) {
    _decrement_topology();
  }
  // from runtime
  else {
    auto state = parent->_nstate;
    if(parent->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      if(state & NSTATE::PREEMPTED) {
        _update_cache(worker, cache, parent);
      }
    }
  }
  recycle(node);
}